

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86::forward_int8(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  int *piVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined8 uVar18;
  undefined4 uVar25;
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined1 uVar32;
  undefined8 uVar33;
  uint uVar40;
  uint uVar41;
  int iVar42;
  int iVar43;
  ulong uVar44;
  ulong uVar45;
  int iVar46;
  ulong uVar47;
  ulong uVar48;
  int iVar49;
  long lVar50;
  undefined8 *puVar51;
  ulong uVar52;
  undefined8 *puVar53;
  int iVar54;
  undefined8 *puVar55;
  undefined8 *puVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  long lVar60;
  int unaff_R13D;
  bool bVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  Mat m;
  Mat m_1;
  Mat local_128;
  ulong local_d8;
  ulong local_d0;
  Mat local_c8;
  int local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  Option *local_60;
  ulong local_58;
  ulong local_50;
  int local_44;
  ulong local_40;
  Mat *local_38;
  undefined4 uVar12;
  undefined3 uVar14;
  undefined2 uVar16;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined3 uVar21;
  undefined1 uVar22;
  undefined2 uVar23;
  undefined1 uVar24;
  undefined4 uVar27;
  undefined3 uVar29;
  undefined2 uVar31;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined3 uVar36;
  undefined1 uVar37;
  undefined2 uVar38;
  undefined1 uVar39;
  
  iVar43 = bottom_blob->elempack;
  if (iVar43 == 8) {
    local_78 = (ulong)(uint)bottom_blob->w;
    local_50 = (ulong)(uint)bottom_blob->h;
    local_7c = bottom_blob->d;
    uVar40 = bottom_blob->c;
    local_d8 = (ulong)uVar40;
    iVar46 = bottom_blob->dims;
    local_70 = bottom_blob->elemsize;
    if (iVar46 == 1) {
      p_Var2 = this->_vptr_Padding_x86[-3];
      uVar40 = *(uint *)(&this->field_0xd8 + (long)p_Var2) + bottom_blob->w * 8 +
               *(int *)(&this->field_0xdc + (long)p_Var2);
      bVar61 = (uVar40 & 7) == 0;
      iVar59 = 1;
      if (bVar61) {
        iVar59 = 8;
      }
      bVar5 = true;
      if ((bVar61 && (*(uint *)(&this->field_0xd8 + (long)p_Var2) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var2) == 0)) {
        Mat::create(top_blob,(int)uVar40 / iVar59,(local_70 >> 3) << bVar61 * '\x03',iVar59,
                    opt->blob_allocator);
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          p_Var2 = this->_vptr_Padding_x86[-3];
          uVar45 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var2);
          iVar59 = *(int *)(&this->field_0xd8 + (long)p_Var2);
          iVar42 = *(int *)(&this->field_0xdc + (long)p_Var2);
          iVar54 = iVar59 + 7;
          if (-1 < iVar59) {
            iVar54 = iVar59;
          }
          iVar59 = iVar42 + 7;
          if (-1 < iVar42) {
            iVar59 = iVar42;
          }
          padding_constant_pack8_int8_sse
                    (bottom_blob,top_blob,0,0,iVar54 >> 3,iVar59 >> 3,
                     uVar45 << 0x38 | uVar45 << 0x30 | uVar45 << 0x28 |
                     uVar45 << 0x20 | uVar45 << 0x18 | uVar45 << 0x10 | uVar45 << 8 | uVar45);
          unaff_R13D = 0;
        }
        bVar5 = false;
      }
      uVar40 = (uint)local_d8;
      if (!bVar5) {
        return unaff_R13D;
      }
    }
    if (iVar46 == 2) {
      p_Var2 = this->_vptr_Padding_x86[-3];
      uVar40 = *(uint *)(&this->field_0xd0 + (long)p_Var2) + (int)local_50 * 8 +
               *(int *)(&this->field_0xd4 + (long)p_Var2);
      bVar61 = (uVar40 & 7) == 0;
      iVar59 = 1;
      if (bVar61) {
        iVar59 = 8;
      }
      bVar5 = true;
      if ((bVar61 && (*(uint *)(&this->field_0xd0 + (long)p_Var2) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var2) == 0)) {
        Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var2) + (int)local_78 +
                             *(int *)(&this->field_0xdc + (long)p_Var2),(int)uVar40 / iVar59,
                    (local_70 >> 3) << bVar61 * '\x03',iVar59,opt->blob_allocator);
        unaff_R13D = -100;
        if (top_blob->data == (void *)0x0) {
          bVar5 = false;
        }
        else {
          bVar5 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var2 = this->_vptr_Padding_x86[-3];
            uVar45 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var2);
            iVar59 = *(int *)(&this->field_0xd0 + (long)p_Var2);
            iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var2);
            iVar54 = iVar59 + 7;
            if (-1 < iVar59) {
              iVar54 = iVar59;
            }
            iVar59 = iVar42 + 7;
            if (-1 < iVar42) {
              iVar59 = iVar42;
            }
            padding_constant_pack8_int8_sse
                      (bottom_blob,top_blob,iVar54 >> 3,iVar59 >> 3,
                       *(int *)(&this->field_0xd8 + (long)p_Var2),
                       *(int *)(&this->field_0xdc + (long)p_Var2),
                       uVar45 << 0x38 | uVar45 << 0x30 | uVar45 << 0x28 |
                       uVar45 << 0x20 | uVar45 << 0x18 | uVar45 << 0x10 | uVar45 << 8 | uVar45);
            unaff_R13D = 0;
            bVar5 = false;
          }
        }
      }
      uVar40 = (uint)local_d8;
      if (!bVar5) {
        return unaff_R13D;
      }
    }
    if (iVar46 == 3) {
      p_Var2 = this->_vptr_Padding_x86[-3];
      uVar41 = *(uint *)(&this->field_0xe8 + (long)p_Var2) + uVar40 * 8 +
               *(int *)(&this->field_0xec + (long)p_Var2);
      bVar61 = (uVar41 & 7) == 0;
      iVar59 = 1;
      if (bVar61) {
        iVar59 = 8;
      }
      bVar5 = true;
      if (bVar61 && (*(uint *)(&this->field_0xe8 + (long)p_Var2) & 7) == 0) {
        if ((uVar41 == uVar40 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var2) == 0)) {
          iVar42 = (int)((long)(int)uVar41 / (long)iVar59);
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var2) + (int)local_78 +
                               *(int *)(&this->field_0xdc + (long)p_Var2),
                      *(int *)(&this->field_0xd0 + (long)p_Var2) + (int)local_50 +
                      *(int *)(&this->field_0xd4 + (long)p_Var2),iVar42,
                      (local_70 >> 3) << bVar61 * '\x03',iVar59,opt->blob_allocator);
          unaff_R13D = -100;
          if (top_blob->data == (void *)0x0) {
            bVar5 = false;
          }
          else {
            bVar5 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar54 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
              iVar57 = iVar54 + 7;
              if (-1 < iVar54) {
                iVar57 = iVar54;
              }
              if (0 < iVar42) {
                local_40 = (long)(int)uVar41 / (long)iVar59 & 0xffffffff;
                uVar45 = 0;
                auVar66 = _DAT_00316630;
                local_60 = opt;
                do {
                  if (top_blob->dims == 3) {
                    local_128.w = top_blob->w;
                    local_128.elemsize = top_blob->elemsize;
                    local_128.data =
                         (void *)(top_blob->cstep * uVar45 * local_128.elemsize +
                                 (long)top_blob->data);
                    local_128.h = top_blob->h;
                    local_128.elempack = top_blob->elempack;
                    local_128.allocator = top_blob->allocator;
                    local_128.dims = 2;
                    local_128.c = 1;
                  }
                  else {
                    local_128.w = top_blob->w;
                    local_128.h = top_blob->h;
                    local_128.c = top_blob->d;
                    local_128.elemsize = top_blob->elemsize;
                    local_128.data =
                         (void *)(top_blob->cstep * uVar45 * local_128.elemsize +
                                 (long)top_blob->data);
                    local_128.elempack = top_blob->elempack;
                    local_128.allocator = top_blob->allocator;
                    local_128.dims = 3;
                  }
                  local_128.d = 1;
                  local_128.refcount._4_4_ = 0;
                  local_128.refcount._0_4_ = 0;
                  local_128.cstep = (long)local_128.h * (long)local_128.w;
                  uVar47 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86[-3]);
                  uVar47 = uVar47 << 0x38 | uVar47 << 0x30 | uVar47 << 0x28 |
                           uVar47 << 0x20 | uVar47 << 0x18 | uVar47 << 0x10 | uVar47 << 8 | uVar47;
                  uVar40 = (int)uVar45 - (iVar57 >> 3);
                  if ((int)uVar40 < 0 || (int)local_d8 <= (int)uVar40) {
                    uVar40 = local_128.c * (int)local_128.cstep;
                    if (0 < (int)uVar40) {
                      lVar50 = (ulong)uVar40 - 1;
                      auVar62._8_4_ = (int)lVar50;
                      auVar62._0_8_ = lVar50;
                      auVar62._12_4_ = (int)((ulong)lVar50 >> 0x20);
                      auVar62 = auVar62 ^ auVar66;
                      uVar44 = 0;
                      auVar65 = _DAT_003166b0;
                      do {
                        auVar64 = auVar65 ^ auVar66;
                        if ((bool)(~(auVar62._4_4_ < auVar64._4_4_ ||
                                    auVar62._0_4_ < auVar64._0_4_ && auVar64._4_4_ == auVar62._4_4_)
                                  & 1)) {
                          *(ulong *)((long)local_128.data + uVar44 * 8) = uVar47;
                        }
                        if (auVar64._12_4_ <= auVar62._12_4_ &&
                            (auVar64._8_4_ <= auVar62._8_4_ || auVar64._12_4_ != auVar62._12_4_)) {
                          *(ulong *)((long)local_128.data + (uVar44 + 1) * 8) = uVar47;
                        }
                        uVar44 = uVar44 + 2;
                        lVar50 = auVar65._8_8_;
                        auVar65._0_8_ = auVar65._0_8_ + 2;
                        auVar65._8_8_ = lVar50 + 2;
                      } while ((uVar40 + 1 & 0xfffffffe) != uVar44);
                    }
                  }
                  else {
                    local_c8.w = bottom_blob->w;
                    local_c8.h = bottom_blob->h;
                    if (bottom_blob->dims == 3) {
                      local_c8.elemsize = bottom_blob->elemsize;
                      local_c8.data =
                           (void *)((ulong)uVar40 * bottom_blob->cstep * local_c8.elemsize +
                                   (long)bottom_blob->data);
                      local_c8.elempack = bottom_blob->elempack;
                      local_c8.allocator = bottom_blob->allocator;
                      local_c8.dims = 2;
                      local_c8.c = 1;
                    }
                    else {
                      local_c8.c = bottom_blob->d;
                      local_c8.elemsize = bottom_blob->elemsize;
                      local_c8.data =
                           (void *)((ulong)uVar40 * bottom_blob->cstep * local_c8.elemsize +
                                   (long)bottom_blob->data);
                      local_c8.elempack = bottom_blob->elempack;
                      local_c8.allocator = bottom_blob->allocator;
                      local_c8.dims = 3;
                    }
                    local_c8.d = 1;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.refcount._0_4_ = 0;
                    local_c8.cstep = (long)local_c8.h * (long)local_c8.w;
                    p_Var2 = this->_vptr_Padding_x86[-3];
                    local_58 = uVar45;
                    if (*(int *)(&this->field_0xe0 + (long)p_Var2) == 0) {
                      padding_constant_pack8_int8_sse
                                (&local_c8,&local_128,*(int *)(&this->field_0xd0 + (long)p_Var2),
                                 *(int *)(&this->field_0xd4 + (long)p_Var2),
                                 *(int *)(&this->field_0xd8 + (long)p_Var2),
                                 *(int *)(&this->field_0xdc + (long)p_Var2),uVar47);
                      auVar66 = _DAT_00316630;
                    }
                    opt = local_60;
                    pp_Var3 = this->_vptr_Padding_x86;
                    p_Var2 = pp_Var3[-3];
                    if (*(int *)(&this->field_0xe0 + (long)p_Var2) == 1) {
                      iVar59 = *(int *)(&this->field_0xd0 + (long)p_Var2);
                      iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var2);
                      iVar54 = *(int *)(&this->field_0xd8 + (long)p_Var2);
                      iVar1 = *(int *)(&this->field_0xdc + (long)p_Var2);
                      puVar55 = (undefined8 *)local_128.data;
                      if (0 < iVar59) {
                        iVar58 = 0;
                        do {
                          iVar49 = iVar54;
                          if (0 < iVar54) {
                            do {
                              *puVar55 = *local_c8.data;
                              puVar55 = puVar55 + 1;
                              iVar49 = iVar49 + -1;
                            } while (iVar49 != 0);
                          }
                          puVar53 = (undefined8 *)local_c8.data;
                          if (0 < local_c8.w) {
                            lVar60 = 0;
                            lVar50 = 0;
                            do {
                              puVar55[lVar50] = *(undefined8 *)((long)local_c8.data + lVar50 * 8);
                              lVar50 = lVar50 + 1;
                              lVar60 = lVar60 + -8;
                            } while (local_c8.w != (int)lVar50);
                            puVar55 = (undefined8 *)((long)puVar55 - lVar60);
                            puVar53 = (undefined8 *)((long)local_c8.data - lVar60);
                          }
                          iVar49 = iVar1;
                          if (0 < iVar1) {
                            do {
                              *puVar55 = puVar53[-1];
                              puVar55 = puVar55 + 1;
                              iVar49 = iVar49 + -1;
                            } while (iVar49 != 0);
                          }
                          iVar58 = iVar58 + 1;
                        } while (iVar58 != iVar59);
                      }
                      puVar53 = (undefined8 *)local_c8.data;
                      if (0 < local_c8.h) {
                        iVar59 = 0;
                        do {
                          iVar58 = iVar54;
                          if (0 < iVar54) {
                            do {
                              *puVar55 = *puVar53;
                              puVar55 = puVar55 + 1;
                              iVar58 = iVar58 + -1;
                            } while (iVar58 != 0);
                          }
                          if (0 < local_c8.w) {
                            lVar50 = 0;
                            lVar60 = 0;
                            do {
                              puVar55[lVar60] = puVar53[lVar60];
                              lVar60 = lVar60 + 1;
                              lVar50 = lVar50 + -8;
                            } while (local_c8.w != (int)lVar60);
                            puVar55 = (undefined8 *)((long)puVar55 - lVar50);
                            puVar53 = (undefined8 *)((long)puVar53 - lVar50);
                          }
                          iVar58 = iVar1;
                          if (0 < iVar1) {
                            do {
                              *puVar55 = puVar53[-1];
                              puVar55 = puVar55 + 1;
                              iVar58 = iVar58 + -1;
                            } while (iVar58 != 0);
                          }
                          iVar59 = iVar59 + 1;
                        } while (iVar59 != local_c8.h);
                      }
                      if (0 < iVar42) {
                        puVar53 = puVar53 + -(long)local_c8.w;
                        iVar59 = 0;
                        do {
                          iVar58 = iVar54;
                          if (0 < iVar54) {
                            do {
                              *puVar55 = *puVar53;
                              puVar55 = puVar55 + 1;
                              iVar58 = iVar58 + -1;
                            } while (iVar58 != 0);
                          }
                          puVar51 = puVar53;
                          if (0 < local_c8.w) {
                            lVar50 = 0;
                            lVar60 = 0;
                            do {
                              puVar55[lVar60] = puVar53[lVar60];
                              lVar60 = lVar60 + 1;
                              lVar50 = lVar50 + -8;
                            } while (local_c8.w != (int)lVar60);
                            puVar55 = (undefined8 *)((long)puVar55 - lVar50);
                            puVar51 = (undefined8 *)((long)puVar53 - lVar50);
                          }
                          iVar58 = iVar1;
                          if (0 < iVar1) {
                            do {
                              *puVar55 = puVar51[-1];
                              puVar55 = puVar55 + 1;
                              iVar58 = iVar58 + -1;
                            } while (iVar58 != 0);
                          }
                          iVar59 = iVar59 + 1;
                        } while (iVar59 != iVar42);
                      }
                    }
                    p_Var2 = pp_Var3[-3];
                    if (*(int *)(&this->field_0xe0 + (long)p_Var2) == 2) {
                      local_44 = *(int *)(&this->field_0xd0 + (long)p_Var2);
                      iVar59 = *(int *)(&this->field_0xd4 + (long)p_Var2);
                      uVar40 = *(uint *)(&this->field_0xd8 + (long)p_Var2);
                      local_d0 = (ulong)(int)uVar40;
                      uVar45 = (ulong)uVar40;
                      uVar41 = *(uint *)(&this->field_0xdc + (long)p_Var2);
                      uVar47 = (ulong)uVar41;
                      local_68 = (ulong)local_c8.w;
                      puVar55 = (undefined8 *)
                                ((long)local_c8.data + (long)(local_c8.w * local_44) * 8);
                      puVar53 = (undefined8 *)local_128.data;
                      if (0 < local_44) {
                        puVar51 = (undefined8 *)
                                  ((long)local_c8.data +
                                  (local_d0 + (long)(local_c8.w * local_44)) * 8);
                        iVar42 = 0;
                        do {
                          if (0 < (int)uVar40) {
                            lVar50 = 0;
                            do {
                              *puVar53 = puVar51[lVar50];
                              puVar53 = puVar53 + 1;
                              lVar50 = lVar50 + -1;
                            } while (-lVar50 != uVar45);
                          }
                          puVar56 = puVar55;
                          if (0 < local_c8.w) {
                            lVar50 = 0;
                            lVar60 = 0;
                            do {
                              puVar53[lVar60] = puVar55[lVar60];
                              lVar60 = lVar60 + 1;
                              lVar50 = lVar50 + -8;
                            } while (local_c8.w != (int)lVar60);
                            puVar53 = (undefined8 *)((long)puVar53 - lVar50);
                            puVar56 = (undefined8 *)((long)puVar55 - lVar50);
                          }
                          if (0 < (int)uVar41) {
                            lVar50 = 0;
                            do {
                              *puVar53 = puVar56[lVar50 + -2];
                              puVar53 = puVar53 + 1;
                              lVar50 = lVar50 + -1;
                            } while (-lVar50 != uVar47);
                          }
                          puVar55 = puVar55 + -local_68;
                          iVar42 = iVar42 + 1;
                          puVar51 = puVar51 + -local_68;
                        } while (iVar42 != local_44);
                      }
                      if (0 < local_c8.h) {
                        iVar42 = 0;
                        do {
                          if (0 < (int)uVar40) {
                            lVar50 = 0;
                            do {
                              *puVar53 = puVar55[local_d0 + lVar50];
                              puVar53 = puVar53 + 1;
                              lVar50 = lVar50 + -1;
                            } while (-lVar50 != uVar45);
                          }
                          if (0 < local_c8.w) {
                            lVar50 = 0;
                            lVar60 = 0;
                            do {
                              puVar53[lVar60] = puVar55[lVar60];
                              lVar60 = lVar60 + 1;
                              lVar50 = lVar50 + -8;
                            } while (local_c8.w != (int)lVar60);
                            puVar53 = (undefined8 *)((long)puVar53 - lVar50);
                            puVar55 = (undefined8 *)((long)puVar55 - lVar50);
                          }
                          if (0 < (int)uVar41) {
                            lVar50 = 0;
                            do {
                              *puVar53 = puVar55[lVar50 + -2];
                              puVar53 = puVar53 + 1;
                              lVar50 = lVar50 + -1;
                            } while (-lVar50 != uVar47);
                          }
                          iVar42 = iVar42 + 1;
                        } while (iVar42 != local_c8.h);
                      }
                      if (0 < iVar59) {
                        puVar51 = puVar55 + -(long)(local_c8.w * 2);
                        puVar55 = puVar55 + (local_d0 - (long)(local_c8.w * 2));
                        iVar42 = 0;
                        do {
                          if (0 < (int)uVar40) {
                            lVar50 = 0;
                            do {
                              *puVar53 = puVar55[lVar50];
                              puVar53 = puVar53 + 1;
                              lVar50 = lVar50 + -1;
                            } while (-lVar50 != uVar45);
                          }
                          puVar56 = puVar51;
                          if (0 < local_c8.w) {
                            lVar50 = 0;
                            lVar60 = 0;
                            do {
                              puVar53[lVar60] = puVar51[lVar60];
                              lVar60 = lVar60 + 1;
                              lVar50 = lVar50 + -8;
                            } while (local_c8.w != (int)lVar60);
                            puVar53 = (undefined8 *)((long)puVar53 - lVar50);
                            puVar56 = (undefined8 *)((long)puVar51 - lVar50);
                          }
                          if (0 < (int)uVar41) {
                            lVar50 = 0;
                            do {
                              *puVar53 = puVar56[lVar50 + -2];
                              puVar53 = puVar53 + 1;
                              lVar50 = lVar50 + -1;
                            } while (-lVar50 != uVar47);
                          }
                          puVar51 = puVar51 + -local_68;
                          iVar42 = iVar42 + 1;
                          puVar55 = puVar55 + -local_68;
                        } while (iVar42 != iVar59);
                      }
                    }
                    piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (local_c8.allocator == (Allocator *)0x0) {
                          if ((undefined8 *)local_c8.data != (undefined8 *)0x0) {
                            free(local_c8.data);
                            auVar66 = _DAT_00316630;
                          }
                        }
                        else {
                          (*(local_c8.allocator)->_vptr_Allocator[3])();
                          auVar66 = _DAT_00316630;
                        }
                      }
                    }
                    local_c8.cstep = 0;
                    local_c8.data = (void *)0x0;
                    local_c8.refcount._0_4_ = 0;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.elemsize = 0;
                    local_c8.elempack = 0;
                    local_c8.dims = 0;
                    local_c8.w = 0;
                    local_c8.h = 0;
                    local_c8.d = 0;
                    local_c8.c = 0;
                    uVar45 = local_58;
                  }
                  piVar4 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (local_128.allocator == (Allocator *)0x0) {
                        if ((undefined8 *)local_128.data != (undefined8 *)0x0) {
                          free(local_128.data);
                          auVar66 = _DAT_00316630;
                        }
                      }
                      else {
                        (*(local_128.allocator)->_vptr_Allocator[3])();
                        auVar66 = _DAT_00316630;
                      }
                    }
                  }
                  local_128.cstep = 0;
                  local_128.data = (void *)0x0;
                  local_128.refcount._0_4_ = 0;
                  local_128.refcount._4_4_ = 0;
                  local_128.elemsize = 0;
                  local_128.elempack = 0;
                  local_128.dims = 0;
                  local_128.w = 0;
                  local_128.h = 0;
                  local_128.d = 0;
                  local_128.c = 0;
                  uVar45 = uVar45 + 1;
                } while (uVar45 != local_40);
              }
              bVar5 = false;
              unaff_R13D = 0;
            }
          }
        }
      }
      if (!bVar5) {
        return unaff_R13D;
      }
    }
    if (iVar46 == 4) {
      p_Var2 = this->_vptr_Padding_x86[-3];
      iVar46 = *(int *)(&this->field_0xe0 + (long)p_Var2);
      if (iVar46 == 0) {
        uVar40 = *(int *)(&this->field_0xe8 + (long)p_Var2) + local_7c +
                 *(int *)(&this->field_0xec + (long)p_Var2);
        Mat::create(top_blob,(int)local_78 + *(int *)(&this->field_0xd8 + (long)p_Var2) +
                             *(int *)(&this->field_0xdc + (long)p_Var2),
                    (int)local_50 + *(int *)(&this->field_0xd0 + (long)p_Var2) +
                    *(int *)(&this->field_0xd4 + (long)p_Var2),uVar40,(int)local_d8,local_70,8,
                    opt->blob_allocator);
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if ((int)local_d8 < 1) {
            unaff_R13D = 0;
          }
          else {
            local_68 = local_68 & 0xffffffff00000000;
            uVar45 = (ulong)uVar40;
            uVar47 = 0;
            auVar66 = _DAT_00316630;
            local_d0 = uVar45;
            local_60 = opt;
            local_38 = top_blob;
            do {
              if (0 < (int)uVar40) {
                uVar44 = (ulong)*(float *)(&this->field_0xe4 + (long)this->_vptr_Padding_x86[-3]);
                uVar44 = uVar44 << 0x38 | uVar44 << 0x30 | uVar44 << 0x28 |
                         uVar44 << 0x20 | uVar44 << 0x18 | uVar44 << 0x10 | uVar44 << 8 | uVar44;
                uVar52 = 0;
                do {
                  local_128.elemsize = top_blob->elemsize;
                  local_128.elempack = top_blob->elempack;
                  local_128.allocator = top_blob->allocator;
                  local_128.h = top_blob->h;
                  local_128.w = top_blob->w;
                  local_128.cstep = (long)local_128.h * (long)local_128.w;
                  local_128.data =
                       (void *)((long)top_blob->data +
                               uVar52 * local_128.elemsize * local_128.cstep +
                               top_blob->cstep * uVar47 * local_128.elemsize);
                  local_128.refcount._0_4_ = 0;
                  local_128.refcount._4_4_ = 0;
                  local_128.dims = 2;
                  local_128.d = 1;
                  local_128.c = 1;
                  iVar46 = (int)uVar52 -
                           *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
                  if (iVar46 < 0 || local_7c <= iVar46) {
                    if (0 < (int)local_128.cstep) {
                      lVar50 = (local_128.cstep & 0xffffffff) - 1;
                      auVar63._8_4_ = (int)lVar50;
                      auVar63._0_8_ = lVar50;
                      auVar63._12_4_ = (int)((ulong)lVar50 >> 0x20);
                      auVar63 = auVar63 ^ auVar66;
                      uVar48 = 0;
                      auVar64 = _DAT_003166b0;
                      do {
                        auVar65 = auVar64 ^ auVar66;
                        if ((bool)(~(auVar63._4_4_ < auVar65._4_4_ ||
                                    auVar63._0_4_ < auVar65._0_4_ && auVar65._4_4_ == auVar63._4_4_)
                                  & 1)) {
                          *(ulong *)((long)local_128.data + uVar48 * 8) = uVar44;
                        }
                        if (auVar65._12_4_ <= auVar63._12_4_ &&
                            (auVar65._8_4_ <= auVar63._8_4_ || auVar65._12_4_ != auVar63._12_4_)) {
                          *(ulong *)((long)local_128.data + uVar48 * 8 + 8) = uVar44;
                        }
                        uVar48 = uVar48 + 2;
                        lVar50 = auVar64._8_8_;
                        auVar64._0_8_ = auVar64._0_8_ + 2;
                        auVar64._8_8_ = lVar50 + 2;
                      } while (((int)local_128.cstep + 1U & 0xfffffffe) != uVar48);
                    }
                  }
                  else {
                    local_c8.elemsize = bottom_blob->elemsize;
                    local_c8.elempack = bottom_blob->elempack;
                    local_c8.allocator = bottom_blob->allocator;
                    local_c8.h = bottom_blob->h;
                    local_c8.w = bottom_blob->w;
                    local_c8.cstep = (long)local_c8.h * (long)local_c8.w;
                    local_c8.data =
                         (void *)((long)bottom_blob->data +
                                 local_c8.cstep * local_c8.elemsize *
                                 ((long)(int)uVar52 -
                                 (long)*(int *)(&this->field_0xe8 +
                                               (long)this->_vptr_Padding_x86[-3])) +
                                 bottom_blob->cstep * uVar47 * local_c8.elemsize);
                    local_c8.refcount._0_4_ = 0;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.dims = 2;
                    local_c8.d = 1;
                    local_c8.c = 1;
                    p_Var2 = this->_vptr_Padding_x86[-3];
                    padding_constant_pack8_int8_sse
                              (&local_c8,&local_128,*(int *)(&this->field_0xd0 + (long)p_Var2),
                               *(int *)(&this->field_0xd4 + (long)p_Var2),
                               *(int *)(&this->field_0xd8 + (long)p_Var2),
                               *(int *)(&this->field_0xdc + (long)p_Var2),uVar44);
                    auVar66 = _DAT_00316630;
                    piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                    if (piVar4 != (int *)0x0) {
                      LOCK();
                      *piVar4 = *piVar4 + -1;
                      UNLOCK();
                      if (*piVar4 == 0) {
                        if (local_c8.allocator == (Allocator *)0x0) {
                          if (local_c8.data != (void *)0x0) {
                            free(local_c8.data);
                            auVar66 = _DAT_00316630;
                          }
                        }
                        else {
                          (*(local_c8.allocator)->_vptr_Allocator[3])();
                          auVar66 = _DAT_00316630;
                        }
                      }
                    }
                    local_c8.cstep = 0;
                    local_c8.data = (void *)0x0;
                    local_c8.refcount._0_4_ = 0;
                    local_c8.refcount._4_4_ = 0;
                    local_c8.elemsize = 0;
                    local_c8.elempack = 0;
                    local_c8.dims = 0;
                    local_c8.w = 0;
                    local_c8.h = 0;
                    local_c8.d = 0;
                    local_c8.c = 0;
                    uVar45 = local_d0;
                    top_blob = local_38;
                  }
                  piVar4 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (local_128.allocator == (Allocator *)0x0) {
                        if (local_128.data != (void *)0x0) {
                          free(local_128.data);
                          auVar66 = _DAT_00316630;
                        }
                      }
                      else {
                        (*(local_128.allocator)->_vptr_Allocator[3])();
                        auVar66 = _DAT_00316630;
                      }
                    }
                  }
                  uVar52 = uVar52 + 1;
                } while (uVar52 != uVar45);
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != local_d8);
            unaff_R13D = 0;
            opt = local_60;
            iVar46 = (int)local_68;
          }
        }
      }
      if (iVar46 == 0) {
        return unaff_R13D;
      }
    }
  }
  local_128.data = bottom_blob->data;
  piVar4 = bottom_blob->refcount;
  local_128.refcount._0_4_ = SUB84(piVar4,0);
  local_128.refcount._4_4_ = (undefined4)((ulong)piVar4 >> 0x20);
  local_128.elemsize = bottom_blob->elemsize;
  local_128.elempack = bottom_blob->elempack;
  local_128.allocator = bottom_blob->allocator;
  uVar6 = bottom_blob->dims;
  uVar7 = bottom_blob->w;
  uVar8 = bottom_blob->h;
  uVar9 = bottom_blob->d;
  local_128.c = bottom_blob->c;
  local_128.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  local_128.dims = uVar6;
  local_128.w = uVar7;
  local_128.h = uVar8;
  local_128.d = uVar9;
  if (iVar43 != 1) {
    local_c8.data = *(void **)opt;
    local_c8.elemsize = (size_t)opt->workspace_allocator;
    uVar10 = opt->openmp_blocktime;
    uVar11 = opt->use_winograd_convolution;
    uVar13 = opt->use_sgemm_convolution;
    uVar15 = opt->use_int8_inference;
    uVar17 = opt->use_vulkan_compute;
    uVar16 = CONCAT11(uVar17,uVar15);
    uVar14 = CONCAT21(uVar16,uVar13);
    uVar12 = CONCAT31(uVar14,uVar11);
    local_c8.allocator = *(Allocator **)&opt->use_bf16_storage;
    uVar18._0_1_ = opt->use_shader_pack8;
    uVar18._1_1_ = opt->use_subgroup_basic;
    uVar18._2_1_ = opt->use_subgroup_vote;
    uVar18._3_1_ = opt->use_subgroup_ballot;
    uVar19 = opt->use_subgroup_shuffle;
    uVar20 = opt->use_image_storage;
    uVar22 = opt->use_tensor_storage;
    uVar24 = opt->use_weight_fp16_storage;
    uVar23 = CONCAT11(uVar24,uVar22);
    uVar21 = CONCAT21(uVar23,uVar20);
    uVar18._4_4_ = CONCAT31(uVar21,uVar19);
    uVar25 = opt->flush_denormals;
    uVar26 = opt->use_local_pool_allocator;
    uVar28 = opt->use_reserved_1;
    uVar30 = opt->use_reserved_2;
    uVar32 = opt->use_reserved_3;
    uVar31 = CONCAT11(uVar32,uVar30);
    uVar29 = CONCAT21(uVar31,uVar28);
    uVar27 = CONCAT31(uVar29,uVar26);
    uVar33._0_1_ = opt->use_reserved_4;
    uVar33._1_1_ = opt->use_reserved_5;
    uVar33._2_1_ = opt->use_reserved_6;
    uVar33._3_1_ = opt->use_reserved_7;
    uVar34 = opt->use_reserved_8;
    uVar35 = opt->use_reserved_9;
    uVar37 = opt->use_reserved_10;
    uVar39 = opt->use_reserved_11;
    uVar38 = CONCAT11(uVar39,uVar37);
    uVar36 = CONCAT21(uVar38,uVar35);
    uVar33._4_4_ = CONCAT31(uVar36,uVar34);
    local_c8.c = (int)uVar33;
    local_c8.dims = (int)uVar18;
    local_c8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_c8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_c8.elempack = uVar10;
    local_c8._28_4_ = uVar12;
    local_c8.w = uVar18._4_4_;
    local_c8.h = uVar25;
    local_c8.d = uVar27;
    local_c8._60_4_ = uVar33._4_4_;
    convert_packing(bottom_blob,&local_128,1,(Option *)&local_c8);
  }
  iVar43 = Padding::forward((Padding *)
                            ((long)&this->_vptr_Padding_x86 + (long)this->_vptr_Padding_x86[-3]),
                            &local_128,top_blob,opt);
  piVar4 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if (local_128.data != (void *)0x0) {
          free(local_128.data);
        }
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar43;
}

Assistant:

int Padding_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}